

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator
          (cmGhsMultiTargetGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  cmLocalGenerator *pcVar3;
  cmMakefile *pcVar4;
  string *psVar5;
  cmValue cVar6;
  string local_50;
  
  this->_vptr_cmGhsMultiTargetGenerator = (_func_int **)&PTR__cmGhsMultiTargetGenerator_008cf9c8;
  this->GeneratorTarget = target;
  pcVar3 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = (cmLocalGhsMultiGenerator *)pcVar3;
  pcVar4 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar4;
  p_Var1 = &(this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TargetNameReal)._M_dataplus._M_p = (pointer)&(this->TargetNameReal).field_2;
  (this->TargetNameReal)._M_string_length = 0;
  (this->TargetNameReal).field_2._M_local_buf[0] = '\0';
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Name,pcVar2,pcVar2 + psVar5->_M_string_length);
  (this->ConfigName)._M_dataplus._M_p = (pointer)&(this->ConfigName).field_2;
  (this->ConfigName)._M_string_length = 0;
  (this->ConfigName).field_2._M_local_buf[0] = '\0';
  pcVar4 = this->Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_BUILD_TYPE","");
  cVar6 = cmMakefile::GetDefinition(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (cVar6.Value == (string *)0x0) {
    (this->ConfigName)._M_string_length = 0;
    *(this->ConfigName)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->ConfigName);
  }
  return;
}

Assistant:

cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator(cmGeneratorTarget* target)
  : GeneratorTarget(target)
  , LocalGenerator(
      static_cast<cmLocalGhsMultiGenerator*>(target->GetLocalGenerator()))
  , Makefile(target->Target->GetMakefile())
  , Name(target->GetName())
{
  // Store the configuration name that is being used
  if (cmValue config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE")) {
    // Use the build type given by the user.
    this->ConfigName = *config;
  } else {
    // No configuration type given.
    this->ConfigName.clear();
  }
}